

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_timing.cpp
# Opt level: O0

void __thiscall
Am_Interactor_Time_Event::Am_Interactor_Time_Event
          (Am_Interactor_Time_Event *this,Am_Time *new_delta,Am_Object *obj,Am_Slot_Key key,
          bool once)

{
  Am_Time local_48;
  Am_Time local_40 [3];
  byte local_23;
  Am_Slot_Key local_22;
  bool once_local;
  Am_Object *pAStack_20;
  Am_Slot_Key key_local;
  Am_Object *obj_local;
  Am_Time *new_delta_local;
  Am_Interactor_Time_Event *this_local;
  
  local_23 = once;
  local_22 = key;
  pAStack_20 = obj;
  obj_local = (Am_Object *)new_delta;
  new_delta_local = (Am_Time *)this;
  Am_Object::Am_Object(&this->object);
  Am_Time::Am_Time(&this->delta);
  Am_Time::Am_Time(&this->next_timeout);
  Am_Time::Am_Time(&this->start_time);
  Am_Time::operator=(&this->delta,new_delta);
  Am_Object::operator=(&this->object,obj);
  this->method_slot = local_22;
  this->only_once = (bool)(local_23 & 1);
  am_clock();
  Am_Time::operator=(&this->start_time,local_40);
  Am_Time::~Am_Time(local_40);
  Am_Time::operator+(&local_48,&this->start_time);
  Am_Time::operator=(&this->next_timeout,&local_48);
  Am_Time::~Am_Time(&local_48);
  return;
}

Assistant:

Am_Interactor_Time_Event(Am_Time new_delta, Am_Object obj, Am_Slot_Key key,
                           bool once)
  {
    delta = new_delta;
    object = obj;
    method_slot = key;
    only_once = once;
    start_time = am_clock();
    next_timeout = start_time + delta;
  }